

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

size_t xmlBufShrink(xmlBufPtr buf,size_t len)

{
  xmlBufferAllocationScheme xVar1;
  xmlChar *__dest;
  ulong uVar2;
  size_t __n;
  xmlChar *__src;
  
  if ((buf != (xmlBufPtr)0x0) && (buf->error == 0)) {
    uVar2 = (ulong)buf->compat_size;
    if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
      buf->size = uVar2;
    }
    uVar2 = (ulong)buf->compat_use;
    if ((uVar2 < 0x7fffffff) && (buf->use != uVar2)) {
      buf->use = uVar2;
    }
    if ((len != 0) && (__n = buf->use - len, len <= buf->use)) {
      buf->use = __n;
      xVar1 = buf->alloc;
      if ((xVar1 == XML_BUFFER_ALLOC_IMMUTABLE) ||
         ((xVar1 == XML_BUFFER_ALLOC_IO && (buf->contentIO != (xmlChar *)0x0)))) {
        __src = buf->content + len;
        buf->content = __src;
        uVar2 = buf->size - len;
        buf->size = uVar2;
        if ((xVar1 == XML_BUFFER_ALLOC_IO) &&
           ((__dest = buf->contentIO, __dest != (xmlChar *)0x0 &&
            (uVar2 <= (ulong)((long)__src - (long)__dest))))) {
          memmove(__dest,__src,__n);
          buf->content = buf->contentIO;
          buf->contentIO[buf->use] = '\0';
          buf->size = buf->size + ((long)__src - (long)__dest);
        }
      }
      else {
        memmove(buf->content,buf->content + len,__n);
        buf->content[buf->use] = '\0';
      }
      uVar2 = buf->size;
      if (0x7ffffffe < uVar2) {
        uVar2 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar2;
      uVar2 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar2 = buf->use;
      }
      buf->compat_use = (uint)uVar2;
      return len;
    }
  }
  return 0;
}

Assistant:

size_t
xmlBufShrink(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (buf->error != 0)) return(0);
    CHECK_COMPAT(buf)
    if (len == 0) return(0);
    if (len > buf->use) return(0);

    buf->use -= len;
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL))) {
	/*
	 * we just move the content pointer, but also make sure
	 * the perceived buffer size has shrunk accordingly
	 */
        buf->content += len;
	buf->size -= len;

        /*
	 * sometimes though it maybe be better to really shrink
	 * on IO buffers
	 */
	if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
	    size_t start_buf = buf->content - buf->contentIO;
	    if (start_buf >= buf->size) {
		memmove(buf->contentIO, &buf->content[0], buf->use);
		buf->content = buf->contentIO;
		buf->content[buf->use] = 0;
		buf->size += start_buf;
	    }
	}
    } else {
	memmove(buf->content, &buf->content[len], buf->use);
	buf->content[buf->use] = 0;
    }
    UPDATE_COMPAT(buf)
    return(len);
}